

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O3

void __thiscall
vk::DescriptorSetUpdateBuilder::update
          (DescriptorSetUpdateBuilder *this,DeviceInterface *vk,VkDevice device)

{
  pointer pVVar1;
  VkBufferView **ppVVar2;
  long lVar3;
  pointer pVVar4;
  pointer *ppHVar5;
  ulong uVar6;
  pointer pVVar7;
  vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> writes;
  vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> local_38;
  
  std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::vector
            (&local_38,&this->m_writes);
  lVar3 = (long)(this->m_writes).
                super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_writes).
                super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    pVVar4 = (pointer)0x0;
  }
  else {
    lVar3 = lVar3 >> 6;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    ppHVar5 = &(((this->m_writeDescriptorInfos).
                 super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start)->texelBufferViews).
               super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppVVar2 = &(local_38.
                super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_start)->pTexelBufferView;
    do {
      if ((VkDescriptorImageInfo *)ppHVar5[-7] != (VkDescriptorImageInfo *)ppHVar5[-6]) {
        ppVVar2[-2] = (VkBufferView *)ppHVar5[-7];
      }
      if ((VkDescriptorBufferInfo *)ppHVar5[-4] != (VkDescriptorBufferInfo *)ppHVar5[-3]) {
        ppVVar2[-1] = (VkBufferView *)ppHVar5[-4];
      }
      if (((_Vector_impl_data *)(ppHVar5 + -1))->_M_start != *ppHVar5) {
        *ppVVar2 = ((_Vector_impl_data *)(ppHVar5 + -1))->_M_start;
      }
      ppHVar5 = ppHVar5 + 9;
      ppVVar2 = ppVVar2 + 8;
      lVar3 = lVar3 + -1;
      pVVar4 = local_38.
               super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar3 != 0);
  }
  pVVar1 = (this->m_copies).
           super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(this->m_copies).
                super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  pVVar7 = (pointer)0x0;
  if (uVar6 != 0) {
    pVVar7 = pVVar1;
  }
  (*vk->_vptr_DeviceInterface[0x3e])
            (vk,device,
             (ulong)((long)local_38.
                           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_38.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 6,pVVar4,
             (ulong)(uint)((int)(uVar6 >> 3) * -0x49249249),pVVar7);
  if (local_38.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DescriptorSetUpdateBuilder::update (const DeviceInterface& vk, VkDevice device) const
{
	// Update VkWriteDescriptorSet structures with stored info
	std::vector<VkWriteDescriptorSet> writes	= m_writes;

	for (size_t writeNdx = 0; writeNdx < m_writes.size(); writeNdx++)
	{
		const WriteDescriptorInfo& writeInfo = m_writeDescriptorInfos[writeNdx];

		if (!writeInfo.imageInfos.empty())
			writes[writeNdx].pImageInfo			= &writeInfo.imageInfos[0];

		if (!writeInfo.bufferInfos.empty())
			writes[writeNdx].pBufferInfo		= &writeInfo.bufferInfos[0];

		if (!writeInfo.texelBufferViews.empty())
			writes[writeNdx].pTexelBufferView	= &writeInfo.texelBufferViews[0];
	}

	const VkWriteDescriptorSet* const	writePtr	= (m_writes.empty()) ? (DE_NULL) : (&writes[0]);
	const VkCopyDescriptorSet* const	copyPtr		= (m_copies.empty()) ? (DE_NULL) : (&m_copies[0]);

	vk.updateDescriptorSets(device, (deUint32)writes.size(), writePtr, (deUint32)m_copies.size(), copyPtr);
}